

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_infinity(void)

{
  byte bVar1;
  undefined8 uVar2;
  double *pdVar3;
  char *pcVar4;
  char **j;
  char *partial [4];
  char *bad [9];
  char *negs [4];
  char *infs [4];
  double d;
  bson_t b;
  bson_error_t error;
  char **local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined8 local_428;
  long local_420 [10];
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined8 local_398;
  double local_388;
  undefined1 local_380 [240];
  uint local_290;
  uint local_28c;
  char acStack_288 [640];
  
  local_3b0 = "{ \"d\": Infinity }";
  local_3a8 = "{ \"d\": infinity }";
  local_3a0 = "{ \"d\": inFINIty }";
  local_398 = 0;
  local_3d0 = "{ \"d\": -Infinity }";
  local_3c8 = "{ \"d\": -infinity }";
  local_3c0 = "{ \"d\": -inFINIty }";
  local_3b8 = 0;
  memcpy(local_420,&PTR_anon_var_dwarf_d2eb_001624e0,0x48);
  local_428 = 0;
  local_430 = "{ \"d\": i";
  local_438 = "{ \"d\": I";
  local_440 = "{ \"d\": In";
  if (local_3b0 != (char *)0x0) {
    bVar1 = bson_init_from_json(local_380,local_3b0,0xffffffffffffffff,&local_290);
    if ((bVar1 & 1) == 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x8b5,"test_bson_json_infinity","bson_init_from_json (&b, *j, -1, &error)");
      abort();
    }
    uVar2 = bson_bcone_magic();
    pdVar3 = bcon_ensure_double_ptr(&local_388);
    bVar1 = bcon_extract(local_380,"d",uVar2,1,pdVar3,0);
    if ((bVar1 & 1) != 0) {
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x8b8,"test_bson_json_infinity","d == d && ((d - d) != (d - d))");
      abort();
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8b6,"test_bson_json_infinity","BCON_EXTRACT (&b, \"d\", BCONE_DOUBLE (d))");
    abort();
  }
  if (local_3d0 == (char *)0x0) {
    local_448 = (char **)local_420;
    while( true ) {
      if (*local_448 == (char *)0x0) {
        local_448 = &local_440;
        while( true ) {
          if (*local_448 == (char *)0x0) {
            return;
          }
          bVar1 = bson_init_from_json(local_380,*local_448,0xffffffffffffffff,&local_290);
          if (((bVar1 ^ 0xff) & 1) == 0) {
            fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                    ,0x8ce,"test_bson_json_infinity","!bson_init_from_json (&b, *j, -1, &error)");
            abort();
          }
          if (local_290 != 1) {
            fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_290,"==",
                    1,
                    "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                    ,0x8d2,"test_bson_json_infinity");
            abort();
          }
          if (local_28c != 1) break;
          pcVar4 = strstr(acStack_288,"Incomplete JSON");
          if (pcVar4 == (char *)0x0) {
            fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_288,
                    "Incomplete JSON");
            abort();
          }
          local_448 = local_448 + 1;
        }
        fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_28c,"==",1,
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                ,0x8d2,"test_bson_json_infinity");
        abort();
      }
      bVar1 = bson_init_from_json(local_380,*local_448,0xffffffffffffffff,&local_290);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                ,0x8c6,"test_bson_json_infinity","!bson_init_from_json (&b, *j, -1, &error)");
        abort();
      }
      if (local_290 != 1) break;
      if (local_28c != 1) {
        fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_28c,"==",1,
                "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
                ,0x8ca,"test_bson_json_infinity");
        abort();
      }
      pcVar4 = strstr(acStack_288,"Got parse error at");
      if (pcVar4 == (char *)0x0) {
        fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_288,
                "Got parse error at");
        abort();
      }
      local_448 = local_448 + 1;
    }
    fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_290,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8ca,"test_bson_json_infinity");
    abort();
  }
  bVar1 = bson_init_from_json(local_380,local_3d0,0xffffffffffffffff,&local_290);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8bd,"test_bson_json_infinity","bson_init_from_json (&b, *j, -1, &error)");
    abort();
  }
  uVar2 = bson_bcone_magic();
  pdVar3 = bcon_ensure_double_ptr(&local_388);
  bVar1 = bcon_extract(local_380,"d",uVar2,1,pdVar3,0);
  if ((bVar1 & 1) != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8c0,"test_bson_json_infinity","d == d && ((d - d) != (d - d))");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x8be,"test_bson_json_infinity","BCON_EXTRACT (&b, \"d\", BCONE_DOUBLE (d))");
  abort();
}

Assistant:

static void
test_bson_json_infinity (void)
{
   bson_error_t error;
   bson_t b;
   double d;

   /* should parse any capitalization of Infinity */
   const char *infs[] = {"{ \"d\": Infinity }",
                         "{ \"d\": infinity }",
                         "{ \"d\": inFINIty }",
                         NULL};

   const char *negs[] = {"{ \"d\": -Infinity }",
                         "{ \"d\": -infinity }",
                         "{ \"d\": -inFINIty }",
                         NULL};

   const char *bad[] = {"{ \"d\": Infinityy }",
                        "{ \"d\": Infinit }",
                        "{ \"d\": -Infinityy }",
                        "{ \"d\": -Infinit }",
                        "{ \"d\": infinityy }",
                        "{ \"d\": infinit }",
                        "{ \"d\": -infinityy }",
                        "{ \"d\": -infinit }",
                        NULL};

   const char *partial[] = {"{ \"d\": In", "{ \"d\": I", "{ \"d\": i", NULL};
   const char **j;

   for (j = infs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      bson_destroy (&b);
   }

   for (j = negs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      BSON_ASSERT (d < 0);
      bson_destroy (&b);
   }

   for (j = bad; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Got parse error at");
   }

   for (j = partial; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Incomplete JSON");
   }
}